

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLFormatter.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XMLFormatter::specialFormat
          (XMLFormatter *this,XMLCh *toFormat,XMLSize_t count,EscapeFlags escapeFlags)

{
  XMLCh *pXVar1;
  XMLCh *pXVar2;
  XMLCh XVar3;
  int iVar4;
  long lVar5;
  
  pXVar1 = toFormat + count;
  do {
    while( true ) {
      if (pXVar1 <= toFormat) {
        return;
      }
      lVar5 = 0;
      while ((pXVar2 = (XMLCh *)((long)toFormat + lVar5), pXVar2 < pXVar1 &&
             (iVar4 = (*this->fXCoder->_vptr_XMLTranscoder[4])(this->fXCoder,(ulong)(ushort)*pXVar2)
             , (char)iVar4 != '\0'))) {
        lVar5 = lVar5 + 2;
      }
      if (pXVar2 <= toFormat) break;
      formatBuf(this,toFormat,lVar5 >> 1,escapeFlags,UnRep_Fail);
      toFormat = pXVar2;
    }
    do {
      if (pXVar1 <= toFormat) break;
      XVar3 = *toFormat;
      if ((XVar3 & 0xfc00U) == 0xd800) {
        pXVar2 = toFormat + 1;
        toFormat = toFormat + 1;
        writeCharRef(this,(ulong)((uint)(ushort)XVar3 * 0x400 + (uint)(ushort)*pXVar2 + 0xfca02400))
        ;
      }
      else {
        writeCharRef(this,toFormat);
      }
      pXVar2 = toFormat + 1;
      toFormat = toFormat + 1;
      iVar4 = (*this->fXCoder->_vptr_XMLTranscoder[4])(this->fXCoder,(ulong)(ushort)*pXVar2);
    } while ((char)iVar4 == '\0');
  } while( true );
}

Assistant:

void XMLFormatter::specialFormat(const  XMLCh* const    toFormat
                                , const XMLSize_t       count
                                , const EscapeFlags     escapeFlags)
{
    //
    //  We have to check each character and see if it could be represented.
    //  As long as it can, we just keep up with where we started and how
    //  many chars we've checked. When we hit an unrepresentable one, we
    //  stop, transcode everything we've collected, then start handling
    //  the unrepresentables via char refs. We repeat this until we get all
    //  the chars done.
    //
    const XMLCh*    srcPtr = toFormat;
    const XMLCh*    endPtr = toFormat + count;

    while (srcPtr < endPtr)
    {
        const XMLCh* tmpPtr = srcPtr;
        while (tmpPtr < endPtr)
        {
            if (fXCoder->canTranscodeTo(*tmpPtr))
                tmpPtr++;
            else
                break;
        }

        if (tmpPtr > srcPtr)
        {
            // We got at least some chars that can be done normally
            formatBuf
            (
                srcPtr
                , tmpPtr - srcPtr
                , escapeFlags
                , XMLFormatter::UnRep_Fail
            );

            // Update the source pointer to our new spot
            srcPtr = tmpPtr;
        }
         else
        {

            //  We hit something unrepresentable. So continue forward doing
            //  char refs until we hit something representable again or the
            //  end of input.
            //
            while (srcPtr < endPtr)
            {
                if ((*srcPtr & 0xFC00) == 0xD800) {
                    // we have encountered a surrogate, need to recombine before printing out
                    // use writeCharRef that takes XMLSize_t to get values larger than
                    // hex 0xFFFF printed.
                    tmpPtr = srcPtr;
                    tmpPtr++; // point at low surrogate
                    writeCharRef((XMLSize_t) (0x10000+((*srcPtr-0xD800)<<10)+*tmpPtr-0xDC00));
                    srcPtr++; // advance to low surrogate (will advance again below)
                }
                else {
                    writeCharRef(*srcPtr);
                }

                // Move up the source pointer and break out if needed
                srcPtr++;
                if (fXCoder->canTranscodeTo(*srcPtr))
                    break;
            }
        }
    }
}